

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

String * Process::getExecutablePath(void)

{
  uint uVar1;
  usize length;
  String *in_RDI;
  char procFilePath [32];
  char path [4097];
  char acStack_1038 [32];
  char local_1018 [4104];
  
  uVar1 = getpid();
  sprintf(acStack_1038,"/proc/%d/exe",(ulong)uVar1);
  length = readlink(acStack_1038,local_1018,0x1001);
  if (length == 0xffffffffffffffff) {
    in_RDI->data = &String::emptyData.super_Data;
  }
  else {
    String::String(in_RDI,local_1018,length);
  }
  return in_RDI;
}

Assistant:

String Process::getExecutablePath()
{
#ifdef _WIN32
  char path[MAX_PATH + 1];
  DWORD len = GetModuleFileName(NULL, path, sizeof(path) / sizeof(*path));
  if (len != sizeof(path) / sizeof(*path))
    return String::fromCString(path, len);
  Buffer buffer;
  buffer.resize((MAX_PATH << 1) * sizeof(char));
  for (;;)
  {
    DWORD len = GetModuleFileName(NULL, (char*)(byte*)buffer, (DWORD)buffer.size());
    if (len != buffer.size() / sizeof(char))
      return String::fromCString(path, len);
    buffer.resize(buffer.size() << 1);
  }
#else
  char procFilePath[32];
  sprintf(procFilePath, "/proc/%d/exe", getpid());
  char path[PATH_MAX + 1];
  ssize_t len = readlink(procFilePath, path, sizeof(path));
  if (len == -1)
    return String();
  return String::fromCString(path, len);
#endif
}